

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNESROM.cpp
# Opt level: O2

void __thiscall SNESROM::SNESROM(SNESROM *this,string *ROMImagePath)

{
  SNESROMHeader *this_00;
  pointer puVar1;
  pointer puVar2;
  uint __line;
  bool bVar3;
  Logger *pLVar4;
  ROMAddress *this_01;
  ulong uVar5;
  char *__assertion;
  double __x;
  double __x_00;
  double __x_01;
  ImageAddress headerAddress;
  allocator local_79;
  SNESROMHeader local_78 [4];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  readBytesFromFile(&this->m_actualImageData,ROMImagePath);
  this->m_headerlessImageData = (uint8_t *)0x0;
  this_00 = &this->m_SNESROMHeader;
  SNESROMHeader::SNESROMHeader(this_00);
  (this->m_SMCHeader).m_bytes = (uint8_t *)0x0;
  puVar1 = (this->m_actualImageData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_actualImageData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar2 - (long)puVar1;
  if ((uVar5 & 0x1ff) == 0) {
    if (puVar2 != puVar1) {
      uVar5 = (ulong)((uint)uVar5 & 0x200);
      this->m_headerlessImageData = puVar1 + uVar5;
      if (uVar5 != 0) {
        (this->m_SMCHeader).m_bytes = puVar1;
        pLVar4 = Logger::Instance();
        std::__cxx11::string::string
                  ((string *)local_78,"ROM has a SMC-Header",(allocator *)&headerAddress);
        std::__cxx11::to_string(&local_58,0x3f);
        std::operator+(&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp:"
                       ,&local_58);
        Logger::log(pLVar4,__x);
        std::__cxx11::string::~string((string *)&local_38);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)local_78);
        this_01 = getROMAddressObject((RomLayout)((this->m_SMCHeader).m_bytes[2] != '\0'));
        ROMAddress::setROMAddress(this_01,0xffc0);
        (**this_01->_vptr_ROMAddress)(&headerAddress,this_01);
        operator_delete(this_01);
        bVar3 = SNESROMHeader::mayBeThere(this->m_headerlessImageData + headerAddress.t);
        if (bVar3) {
          SNESROMHeader::SNESROMHeader(local_78,this->m_headerlessImageData + headerAddress.t);
          SNESROMHeader::operator=(this_00,local_78);
          SNESROMHeader::~SNESROMHeader(local_78);
        }
        else {
          pLVar4 = Logger::Instance();
          std::__cxx11::string::string
                    ((string *)local_78,"SMC-Header lies about ROM layout",&local_79);
          std::__cxx11::to_string(&local_58,0x4f);
          std::operator+(&local_38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp:"
                         ,&local_58);
          Logger::log(pLVar4,__x_00);
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)local_78);
        }
        checkRomLayout(this);
      }
      if (this_00->m_HeaderData == (uint8_t *)0x0) {
        bVar3 = SNESROMHeader::mayBeThere(this->m_headerlessImageData + 0x7fc0);
        if (bVar3) {
          SNESROMHeader::SNESROMHeader(local_78,this->m_headerlessImageData + 0x7fc0);
        }
        else {
          bVar3 = SNESROMHeader::mayBeThere(this->m_headerlessImageData + 0xffc0);
          if (!bVar3) {
            pLVar4 = Logger::Instance();
            std::__cxx11::string::string
                      ((string *)local_78,"There is no SNES header",(allocator *)&headerAddress);
            std::__cxx11::to_string(&local_58,0x5f);
            std::operator+(&local_38,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp:"
                           ,&local_58);
            Logger::log(pLVar4,__x_01);
            std::__cxx11::string::~string((string *)&local_38);
            std::__cxx11::string::~string((string *)&local_58);
            std::__cxx11::string::~string((string *)local_78);
            return;
          }
          SNESROMHeader::SNESROMHeader(local_78,this->m_headerlessImageData + 0xffc0);
        }
        SNESROMHeader::operator=(this_00,local_78);
        SNESROMHeader::~SNESROMHeader(local_78);
      }
      return;
    }
    __assertion = "m_actualImageData.size() > 0";
    __line = 0x38;
  }
  else {
    __assertion = "m_actualImageData.size() % 512 == 0";
    __line = 0x37;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp"
                ,__line,"SNESROM::SNESROM(const std::string &)");
}

Assistant:

SNESROM::SNESROM(const std::string &ROMImagePath)
    : m_actualImageData(readBytesFromFile(ROMImagePath)),
      m_headerlessImageData(nullptr){

    assert( m_actualImageData.size() % 512 == 0);
    assert( m_actualImageData.size() > 0);

    m_headerlessImageData = &m_actualImageData[0] +  m_actualImageData.size() % 1024;

    //this implies a SMC header
    if( m_actualImageData.size() % 1024 != 0){
        m_SMCHeader.load(&m_actualImageData[0]);
        LOG_SRC(STATE, "ROM has a SMC-Header");

        //since we have a SMC header, we ask it for lo/hi-rom status
        //not that this might be faulty so we gonna ignore that anyway
        RomLayout layout = m_SMCHeader.layout();

        //now that we know what rom-type it is, we can use that to find the header
        ROMAddress* SNESHeaderROMAddress = getROMAddressObject(layout);
        SNESHeaderROMAddress->setROMAddress(0x00FFC0);
        ImageAddress headerAddress = SNESHeaderROMAddress->toImageAddress();
        delete SNESHeaderROMAddress;

        //it is there. nice
        if(SNESROMHeader::mayBeThere(m_headerlessImageData + headerAddress)){
           m_SNESROMHeader = SNESROMHeader(m_headerlessImageData + headerAddress);
        }else{
            LOG_SRC(WARNING, "SMC-Header lies about ROM layout");
        }


        //bad programming: we ignore everything above and use the new check function
        layout = checkRomLayout();
    }

    if(!m_SNESROMHeader){
        if(SNESROMHeader::mayBeThere(m_headerlessImageData + 0x7fc0)){
            //headerless lorom
            m_SNESROMHeader = SNESROMHeader(m_headerlessImageData + 0x7fc0);
        }else if(SNESROMHeader::mayBeThere(m_headerlessImageData + 0xffc0)){
            //headerless hirom
            m_SNESROMHeader = SNESROMHeader(m_headerlessImageData + 0xffc0);
        }else{
            LOG_SRC(ERROR, "There is no SNES header");
        }
    }
}